

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

void __thiscall sf::Text::ensureGeometryUpdate(Text *this)

{
  VertexArray *this_00;
  VertexArray *this_01;
  String *this_02;
  Color *color;
  Color *color_00;
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  byte bVar5;
  Vector2f position;
  bool bVar6;
  Uint32 second;
  Texture *pTVar7;
  Glyph *pGVar8;
  size_t sVar9;
  Uint32 first;
  Font *this_03;
  size_t i;
  ulong index;
  float offset;
  float thickness;
  float offset_00;
  float fVar10;
  float fVar11;
  Vector2f position_00;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float local_f8;
  float local_f4;
  float local_e8;
  float local_c8;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 auVar13 [16];
  undefined1 auVar18 [16];
  undefined1 auVar15 [16];
  
  this_03 = this->m_font;
  if (this_03 != (Font *)0x0) {
    if (this->m_geometryNeedUpdate == false) {
      pTVar7 = Font::getTexture(this_03,this->m_characterSize);
      if (pTVar7->m_cacheId == this->m_fontTextureId) {
        return;
      }
      this_03 = this->m_font;
    }
    pTVar7 = Font::getTexture(this_03,this->m_characterSize);
    this->m_fontTextureId = pTVar7->m_cacheId;
    this->m_geometryNeedUpdate = false;
    this_00 = &this->m_vertices;
    VertexArray::clear(this_00);
    this_01 = &this->m_outlineVertices;
    VertexArray::clear(this_01);
    (this->m_bounds).left = 0.0;
    (this->m_bounds).top = 0.0;
    (this->m_bounds).width = 0.0;
    (this->m_bounds).height = 0.0;
    this_02 = &this->m_string;
    bVar6 = String::isEmpty(this_02);
    if (!bVar6) {
      uVar4 = this->m_style;
      bVar5 = (byte)uVar4;
      bVar6 = (bool)(bVar5 & 1);
      fVar12 = 0.0;
      if ((uVar4 & 2) != 0) {
        fVar12 = 0.209;
      }
      offset = Font::getUnderlinePosition(this->m_font,this->m_characterSize);
      thickness = Font::getUnderlineThickness(this->m_font,this->m_characterSize);
      pGVar8 = Font::getGlyph(this->m_font,0x78,this->m_characterSize,bVar6,0.0);
      offset_00 = (pGVar8->bounds).height * 0.5 + (pGVar8->bounds).top;
      pGVar8 = Font::getGlyph(this->m_font,0x20,this->m_characterSize,bVar6,0.0);
      fVar20 = (this->m_letterSpacingFactor + -1.0) * (pGVar8->advance / 3.0);
      fVar19 = pGVar8->advance + fVar20;
      fVar10 = Font::getLineSpacing(this->m_font,this->m_characterSize);
      fVar1 = this->m_lineSpacingFactor;
      local_c8 = (float)this->m_characterSize;
      color = &this->m_fillColor;
      color_00 = &this->m_outlineColor;
      local_88._4_4_ = local_c8;
      local_88._0_4_ = local_c8;
      fStack_80 = local_c8;
      fStack_7c = local_c8;
      index = 0;
      local_f8 = 0.0;
      local_f4 = 0.0;
      local_e8 = 0.0;
      first = 0;
      while( true ) {
        sVar9 = String::getSize(this_02);
        if (sVar9 <= index) break;
        second = String::operator[](this_02,index);
        fVar11 = local_f4;
        if (second != 0xd) {
          fVar11 = Font::getKerning(this->m_font,first,second,this->m_characterSize,bVar6);
          local_e8 = local_e8 + fVar11;
          if ((first != 10 & bVar5 >> 2 & second == 10) == 1) {
            anon_unknown.dwarf_28453c::addLine(this_00,local_e8,local_c8,color,offset,thickness,0.0)
            ;
            fVar11 = this->m_outlineThickness;
            if ((fVar11 != 0.0) || (NAN(fVar11))) {
              anon_unknown.dwarf_28453c::addLine
                        (this_01,local_e8,local_c8,color_00,offset,thickness,fVar11);
            }
          }
          if ((bVar5 >> 3 & first != 10 & second == 10) == 1) {
            anon_unknown.dwarf_28453c::addLine
                      (this_00,local_e8,local_c8,color,offset_00,thickness,0.0);
            fVar11 = this->m_outlineThickness;
            if ((fVar11 != 0.0) || (NAN(fVar11))) {
              anon_unknown.dwarf_28453c::addLine
                        (this_01,local_e8,local_c8,color_00,offset_00,thickness,fVar11);
            }
            auVar14._4_4_ = extraout_XMM0_Db;
            auVar14._0_4_ = local_c8;
            auVar14._8_4_ = extraout_XMM0_Db;
            auVar14._12_4_ = extraout_XMM0_Dd;
            auVar13._8_8_ = auVar14._8_8_;
            auVar13._4_4_ = local_e8;
            auVar13._0_4_ = local_c8;
            auVar15._0_12_ = auVar13._0_12_;
            auVar15._12_4_ = 0;
            _local_88 = minps(auVar15,_local_88);
LAB_0019f92f:
            local_c8 = local_c8 + fVar10 * fVar1;
            local_e8 = 0.0;
          }
          else {
            if ((0x20 < second) || ((0x100000600U >> ((ulong)second & 0x3f) & 1) == 0)) {
              fVar11 = this->m_outlineThickness;
              if ((fVar11 != 0.0) || (NAN(fVar11))) {
                pGVar8 = Font::getGlyph(this->m_font,second,this->m_characterSize,bVar6,fVar11);
                position_00.y = local_c8;
                position_00.x = local_e8;
                anon_unknown.dwarf_28453c::addGlyphQuad(this_01,position_00,color_00,pGVar8,fVar12);
              }
              position.y = local_c8;
              position.x = local_e8;
              pGVar8 = Font::getGlyph(this->m_font,second,this->m_characterSize,bVar6,0.0);
              anon_unknown.dwarf_28453c::addGlyphQuad(this_00,position,color,pGVar8,fVar12);
              fVar2 = (pGVar8->bounds).left;
              fVar3 = (pGVar8->bounds).top;
              fVar11 = (pGVar8->bounds).height + fVar3;
              fVar21 = (float)((uint)fVar12 | 0x80000000) * fVar3 +
                       fVar2 + (pGVar8->bounds).width + local_e8;
              if (fVar21 <= local_f8) {
                fVar21 = local_f8;
              }
              auVar17._0_4_ = fVar3 + local_c8;
              auVar18._4_8_ = 0;
              auVar18._0_4_ = auVar17._0_4_;
              auVar18._12_4_ = 0x80000000;
              auVar17._8_8_ = auVar18._8_8_;
              auVar17._4_4_ = (float)((uint)fVar12 | 0x80000000) * fVar11 + local_e8 + fVar2;
              _local_88 = minps(auVar17,_local_88);
              fVar11 = fVar11 + local_c8;
              if (fVar11 <= local_f4) {
                fVar11 = local_f4;
              }
              local_e8 = local_e8 + pGVar8->advance + fVar20;
              first = second;
              local_f8 = fVar21;
              goto LAB_0019f965;
            }
            auVar16._4_4_ = local_e8;
            auVar16._0_4_ = local_c8;
            auVar16._8_4_ = extraout_XMM0_Db;
            auVar16._12_4_ = 0;
            _local_88 = minps(auVar16,_local_88);
            if (second == 9) {
              local_e8 = local_e8 + fVar19 * 4.0;
            }
            else {
              if (second == 10) goto LAB_0019f92f;
              if (second == 0x20) {
                local_e8 = local_e8 + fVar19;
              }
            }
          }
          fVar11 = local_e8;
          if (local_e8 <= local_f8) {
            fVar11 = local_f8;
          }
          first = second;
          local_f8 = fVar11;
          fVar11 = local_c8;
          if (local_c8 <= local_f4) {
            fVar11 = local_f4;
          }
        }
LAB_0019f965:
        local_f4 = fVar11;
        index = index + 1;
      }
      fVar12 = this->m_outlineThickness;
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        fVar12 = ceilf(fVar12);
        fVar12 = ABS(fVar12);
        local_f8 = local_f8 + fVar12;
        local_88._4_4_ = (float)local_88._4_4_ - fVar12;
        local_88._0_4_ = (float)local_88._0_4_ - fVar12;
        local_f4 = local_f4 + fVar12;
      }
      if (((uVar4 & 4) != 0) && (0.0 < local_e8)) {
        anon_unknown.dwarf_28453c::addLine(this_00,local_e8,local_c8,color,offset,thickness,0.0);
        fVar12 = this->m_outlineThickness;
        if ((fVar12 != 0.0) || (NAN(fVar12))) {
          anon_unknown.dwarf_28453c::addLine
                    (this_01,local_e8,local_c8,color_00,offset,thickness,fVar12);
        }
      }
      if (((uVar4 & 8) != 0) && (0.0 < local_e8)) {
        anon_unknown.dwarf_28453c::addLine(this_00,local_e8,local_c8,color,offset_00,thickness,0.0);
        fVar12 = this->m_outlineThickness;
        if ((fVar12 != 0.0) || (NAN(fVar12))) {
          anon_unknown.dwarf_28453c::addLine
                    (this_01,local_e8,local_c8,color_00,offset_00,thickness,fVar12);
        }
      }
      (this->m_bounds).left = (float)local_88._4_4_;
      (this->m_bounds).top = (float)local_88._0_4_;
      (this->m_bounds).width = local_f8 - (float)local_88._4_4_;
      (this->m_bounds).height = local_f4 - (float)local_88._0_4_;
    }
  }
  return;
}

Assistant:

void Text::ensureGeometryUpdate() const
{
    if (!m_font)
        return;

    // Do nothing, if geometry has not changed and the font texture has not changed
    if (!m_geometryNeedUpdate && m_font->getTexture(m_characterSize).m_cacheId == m_fontTextureId)
        return;

    // Save the current fonts texture id
    m_fontTextureId = m_font->getTexture(m_characterSize).m_cacheId;

    // Mark geometry as updated
    m_geometryNeedUpdate = false;

    // Clear the previous geometry
    m_vertices.clear();
    m_outlineVertices.clear();
    m_bounds = FloatRect();

    // No text: nothing to draw
    if (m_string.isEmpty())
        return;

    // Compute values related to the text style
    bool  isBold             = m_style & Bold;
    bool  isUnderlined       = m_style & Underlined;
    bool  isStrikeThrough    = m_style & StrikeThrough;
    float italicShear        = (m_style & Italic) ? 0.209f : 0.f; // 12 degrees in radians
    float underlineOffset    = m_font->getUnderlinePosition(m_characterSize);
    float underlineThickness = m_font->getUnderlineThickness(m_characterSize);

    // Compute the location of the strike through dynamically
    // We use the center point of the lowercase 'x' glyph as the reference
    // We reuse the underline thickness as the thickness of the strike through as well
    FloatRect xBounds = m_font->getGlyph(L'x', m_characterSize, isBold).bounds;
    float strikeThroughOffset = xBounds.top + xBounds.height / 2.f;

    // Precompute the variables needed by the algorithm
    float whitespaceWidth = m_font->getGlyph(L' ', m_characterSize, isBold).advance;
    float letterSpacing   = ( whitespaceWidth / 3.f ) * ( m_letterSpacingFactor - 1.f );
    whitespaceWidth      += letterSpacing;
    float lineSpacing     = m_font->getLineSpacing(m_characterSize) * m_lineSpacingFactor;
    float x               = 0.f;
    float y               = static_cast<float>(m_characterSize);

    // Create one quad for each character
    float minX = static_cast<float>(m_characterSize);
    float minY = static_cast<float>(m_characterSize);
    float maxX = 0.f;
    float maxY = 0.f;
    Uint32 prevChar = 0;
    for (std::size_t i = 0; i < m_string.getSize(); ++i)
    {
        Uint32 curChar = m_string[i];

        // Skip the \r char to avoid weird graphical issues
        if (curChar == L'\r')
            continue;

        // Apply the kerning offset
        x += m_font->getKerning(prevChar, curChar, m_characterSize, isBold);

        // If we're using the underlined style and there's a new line, draw a line
        if (isUnderlined && (curChar == L'\n' && prevChar != L'\n'))
        {
            addLine(m_vertices, x, y, m_fillColor, underlineOffset, underlineThickness);

            if (m_outlineThickness != 0)
                addLine(m_outlineVertices, x, y, m_outlineColor, underlineOffset, underlineThickness, m_outlineThickness);
        }

        // If we're using the strike through style and there's a new line, draw a line across all characters
        if (isStrikeThrough && (curChar == L'\n' && prevChar != L'\n'))
        {
            addLine(m_vertices, x, y, m_fillColor, strikeThroughOffset, underlineThickness);

            if (m_outlineThickness != 0)
                addLine(m_outlineVertices, x, y, m_outlineColor, strikeThroughOffset, underlineThickness, m_outlineThickness);
        }

        prevChar = curChar;

        // Handle special characters
        if ((curChar == L' ') || (curChar == L'\n') || (curChar == L'\t'))
        {
            // Update the current bounds (min coordinates)
            minX = std::min(minX, x);
            minY = std::min(minY, y);

            switch (curChar)
            {
                case L' ':  x += whitespaceWidth;     break;
                case L'\t': x += whitespaceWidth * 4; break;
                case L'\n': y += lineSpacing; x = 0;  break;
            }

            // Update the current bounds (max coordinates)
            maxX = std::max(maxX, x);
            maxY = std::max(maxY, y);

            // Next glyph, no need to create a quad for whitespace
            continue;
        }

        // Apply the outline
        if (m_outlineThickness != 0)
        {
            const Glyph& glyph = m_font->getGlyph(curChar, m_characterSize, isBold, m_outlineThickness);

            // Add the outline glyph to the vertices
            addGlyphQuad(m_outlineVertices, Vector2f(x, y), m_outlineColor, glyph, italicShear);
        }

        // Extract the current glyph's description
        const Glyph& glyph = m_font->getGlyph(curChar, m_characterSize, isBold);

        // Add the glyph to the vertices
        addGlyphQuad(m_vertices, Vector2f(x, y), m_fillColor, glyph, italicShear);

        // Update the current bounds
        float left   = glyph.bounds.left;
        float top    = glyph.bounds.top;
        float right  = glyph.bounds.left + glyph.bounds.width;
        float bottom = glyph.bounds.top + glyph.bounds.height;

        minX = std::min(minX, x + left - italicShear * bottom);
        maxX = std::max(maxX, x + right - italicShear * top);
        minY = std::min(minY, y + top);
        maxY = std::max(maxY, y + bottom);

        // Advance to the next character
        x += glyph.advance + letterSpacing;
    }

    // If we're using outline, update the current bounds
    if (m_outlineThickness != 0)
    {
        float outline = std::abs(std::ceil(m_outlineThickness));
        minX -= outline;
        maxX += outline;
        minY -= outline;
        maxY += outline;
    }

    // If we're using the underlined style, add the last line
    if (isUnderlined && (x > 0))
    {
        addLine(m_vertices, x, y, m_fillColor, underlineOffset, underlineThickness);

        if (m_outlineThickness != 0)
            addLine(m_outlineVertices, x, y, m_outlineColor, underlineOffset, underlineThickness, m_outlineThickness);
    }

    // If we're using the strike through style, add the last line across all characters
    if (isStrikeThrough && (x > 0))
    {
        addLine(m_vertices, x, y, m_fillColor, strikeThroughOffset, underlineThickness);

        if (m_outlineThickness != 0)
            addLine(m_outlineVertices, x, y, m_outlineColor, strikeThroughOffset, underlineThickness, m_outlineThickness);
    }

    // Update the bounding rectangle
    m_bounds.left = minX;
    m_bounds.top = minY;
    m_bounds.width = maxX - minX;
    m_bounds.height = maxY - minY;
}